

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall PDA::Transducer::Tokenizer::printIdentifiers(Tokenizer *this)

{
  int iVar1;
  bool bVar2;
  _Setfill<wchar_t> _Var3;
  _Setw _Var4;
  int iVar5;
  wostream *pwVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  Type tp;
  Context cnt;
  Type tp_00;
  wstring local_100;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  wstring local_c8;
  int local_a8;
  wstring local_98;
  int local_78;
  int local_74;
  reference local_70;
  Identifier *identifier;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *__range2;
  int id;
  Tokenizer *this_local;
  
  _Var3 = std::setfill<wchar_t>(L'=');
  pwVar6 = std::operator<<(&std::wcout,_Var3._M_c);
  _Var4 = std::setw(0xbe);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L'\n');
  _Var3 = std::setfill<wchar_t>(L' ');
  std::operator<<(pwVar6,_Var3._M_c);
  pwVar6 = (wostream *)std::wostream::operator<<(&std::wcout,std::left);
  _Var4 = std::setw(5);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"ID");
  _Var4 = std::setw(10);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"TYPE");
  _Var4 = std::setw(0xf);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"CONTEXT");
  _Var4 = std::setw(10);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"RBPOFFSET");
  _Var4 = std::setw(10);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"NAME");
  _Var4 = std::setw(0x14);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"DECORATED");
  _Var4 = std::setw(0x1e);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"VALUE");
  _Var4 = std::setw(10);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"RETTYPE");
  _Var4 = std::setw(5);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"ROW");
  _Var4 = std::setw(5);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"COL");
  _Var4 = std::setw(0x50);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L"FILENAME");
  std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
  __range2._4_4_ = 0;
  __end2 = std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>::
           begin(&this->m_identifiers);
  identifier = (Identifier *)
               std::
               vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>::
               end(&this->m_identifiers);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
                                     *)&identifier), bVar2) {
    local_70 = __gnu_cxx::
               __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
               ::operator*(&__end2);
    local_74 = (int)std::setw(5);
    pwVar6 = std::operator<<((wostream *)&std::wcout,(_Setw)local_74);
    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,__range2._4_4_);
    local_78 = (int)std::setw(10);
    pwVar6 = std::operator<<(pwVar6,(_Setw)local_78);
    Identifier::typeToString_abi_cxx11_(&local_98,(Identifier *)(ulong)local_70->type,tp);
    pwVar6 = std::operator<<(pwVar6,(wstring *)&local_98);
    local_a8 = (int)std::setw(0xf);
    pwVar6 = std::operator<<(pwVar6,(_Setw)local_a8);
    Identifier::contextToString_abi_cxx11_(&local_c8,(Identifier *)(ulong)local_70->context,cnt);
    pwVar6 = std::operator<<(pwVar6,(wstring *)&local_c8);
    local_cc = (int)std::setw(10);
    pwVar6 = std::operator<<(pwVar6,(_Setw)local_cc);
    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,local_70->rbpOffset);
    local_d0 = (int)std::setw(10);
    pwVar6 = std::operator<<(pwVar6,(_Setw)local_d0);
    pwVar6 = std::operator<<(pwVar6,(wstring *)local_70);
    local_d4 = (int)std::setw(0x14);
    pwVar6 = std::operator<<(pwVar6,(_Setw)local_d4);
    pwVar6 = std::operator<<(pwVar6,(wstring *)&local_70->decoratedName);
    local_d8 = (int)std::setw(0x1e);
    std::operator<<(pwVar6,(_Setw)local_d8);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
    std::__cxx11::wstring::~wstring((wstring *)&local_98);
    if (local_70->context == Literal) {
      if (local_70->type == String) {
        std::operator<<((wostream *)&std::wcout,(wstring *)&(local_70->value).stringValue);
      }
      else if ((local_70->type == Integer) || (local_70->type == Bool)) {
        std::wostream::operator<<(&std::wcout,(local_70->value).field_0.intValue);
      }
      else if (local_70->type == Double) {
        std::wostream::operator<<(&std::wcout,(local_70->value).field_0.doubleValue);
      }
      else {
        std::operator<<((wostream *)&std::wcout,L"");
      }
    }
    else {
      std::operator<<((wostream *)&std::wcout,L"");
    }
    local_dc = (int)std::setw(10);
    pwVar6 = std::operator<<((wostream *)&std::wcout,(_Setw)local_dc);
    Identifier::typeToString_abi_cxx11_(&local_100,(Identifier *)(ulong)local_70->returnType,tp_00);
    pwVar6 = std::operator<<(pwVar6,(wstring *)&local_100);
    _Var4 = std::setw(5);
    pwVar6 = std::operator<<(pwVar6,_Var4);
    pvVar7 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
             operator[](&this->m_tokens,(long)local_70->tokenIndex);
    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,pvVar7->line);
    _Var4 = std::setw(5);
    pwVar6 = std::operator<<(pwVar6,_Var4);
    pvVar7 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
             operator[](&this->m_tokens,(long)local_70->tokenIndex);
    iVar1 = pvVar7->position;
    iVar5 = std::__cxx11::wstring::size();
    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,iVar1 - iVar5);
    _Var4 = std::setw(0x50);
    pwVar6 = std::operator<<(pwVar6,_Var4);
    pvVar7 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
             operator[](&this->m_tokens,(long)local_70->tokenIndex);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::operator[](&this->m_files,(long)pvVar7->fileIndex);
    pwVar6 = std::operator<<(pwVar6,(wstring *)pvVar8);
    std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
    std::__cxx11::wstring::~wstring((wstring *)&local_100);
    __gnu_cxx::
    __normal_iterator<const_PDA::Transducer::Identifier_*,_std::vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>_>
    ::operator++(&__end2);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  _Var3 = std::setfill<wchar_t>(L'=');
  pwVar6 = std::operator<<(&std::wcout,_Var3._M_c);
  _Var4 = std::setw(0xbe);
  pwVar6 = std::operator<<(pwVar6,_Var4);
  pwVar6 = std::operator<<(pwVar6,L' ');
  _Var3 = std::setfill<wchar_t>(L' ');
  pwVar6 = std::operator<<(pwVar6,_Var3._M_c);
  std::wostream::operator<<(pwVar6,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

void Tokenizer::printIdentifiers() const
{
    std::wcout << std::setfill(L'=') << std::setw(190) << L'\n' << std::setfill(L' ');
    std::wcout << std::left << std::setw(5) << L"ID" << std::setw(10) << L"TYPE" << std::setw(15) << L"CONTEXT" << std::setw(10) << L"RBPOFFSET" << std::setw(10) << L"NAME" << std::setw(20) << L"DECORATED"
               << std::setw(30) << L"VALUE" << std::setw(10) << L"RETTYPE" << std::setw(5) << L"ROW" << std::setw(5) << L"COL"
               << std::setw(80) << L"FILENAME" << std::endl;
    int id{0};
    for(const Identifier &identifier : m_identifiers)
    {
        std::wcout << std::setw(5) << id++ << std::setw(10) << Identifier::typeToString(identifier.type) << std::setw(15) << Identifier::contextToString(identifier.context)
                   << std::setw(10) << identifier.rbpOffset << std::setw(10) << identifier.name
                   << std::setw(20) << identifier.decoratedName << std::setw(30);
        if (identifier.context == Identifier::Context::Literal)
        {
            if (identifier.type == Identifier::Type::String)
                std::wcout << identifier.value.stringValue;
            else if (identifier.type == Identifier::Type::Integer || identifier.type == Identifier::Type::Bool)
                std::wcout << identifier.value.intValue;
            else if (identifier.type == Identifier::Type::Double)
                std::wcout << identifier.value.doubleValue;
            else
                std::wcout << L"";
        }
        else
            std::wcout << L"";

        std::wcout << std::setw(10) << Identifier::typeToString(identifier.returnType) << std::setw(5)
                   << m_tokens[static_cast<size_t>(identifier.tokenIndex)].line << std::setw(5)
                   << m_tokens[static_cast<size_t>(identifier.tokenIndex)].position - static_cast<int>(identifier.name.size())
                   << std::setw(80) <<  m_files[static_cast<size_t>(m_tokens[static_cast<size_t>(identifier.tokenIndex)].fileIndex)] << std::endl;
    }
    std::wcout << std::setfill(L'=') << std::setw(190) << L' ' << std::setfill(L' ') << std::endl;
}